

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_post.c
# Opt level: O2

char * nhr_request_create_header_POST(nhr_request r,size_t *header_size)

{
  char *mem;
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *mem_00;
  char *__s;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t parameters_len;
  size_t local_50;
  char *local_48;
  size_t *local_40;
  size_t headers_len;
  
  headers_len = 0;
  parameters_len = 0;
  local_40 = header_size;
  sVar3 = strlen(r->path);
  sVar4 = strlen(r->host);
  if (r->is_have_data_parameter == '\0') {
    local_48 = nhr_request_create_url_encoded_parameters_POST(r,&parameters_len);
  }
  else {
    local_48 = (char *)nhr_request_create_data_parameters_POST(r,&parameters_len);
  }
  local_50 = parameters_len;
  sVar7 = parameters_len;
  if (local_48 == (char *)0x0) {
    sVar7 = 0;
  }
  if (r->http_headers == (_nhr_map_node *)0x0) {
    sVar6 = 0;
    mem_00 = (char *)0x0;
  }
  else {
    mem_00 = nhr_request_http_headers(r->http_headers,&headers_len);
    sVar6 = headers_len;
  }
  if (mem_00 == (char *)0x0) {
    sVar6 = 0;
  }
  __s = (char *)nhr_malloc(sVar6 + sVar3 + sVar4 + sVar7 + 0x100);
  iVar1 = sprintf(__s,"%s %s HTTP/%s\r\n","POST",r->path,k_nhr_request_http_ver);
  if (r->port == 0x50) {
    iVar2 = sprintf(__s + iVar1,"Host: %s\r\n",r->host);
  }
  else {
    iVar2 = sprintf(__s + iVar1,"Host: %s:%i\r\n",r->host);
  }
  sVar7 = local_50;
  lVar8 = (long)iVar2 + (long)iVar1;
  if (mem_00 == (char *)0x0) {
    *(undefined2 *)(__s + lVar8) = *(undefined2 *)k_nhr_CRLF;
    lVar5 = 2;
  }
  else {
    iVar1 = sprintf(__s + lVar8,"%s\r\n\r\n",mem_00);
    lVar5 = (long)iVar1;
  }
  mem = local_48;
  sVar6 = lVar5 + lVar8;
  if (sVar7 != 0) {
    memcpy(__s + sVar6,local_48,sVar7);
    *(undefined4 *)(__s + sVar6 + sVar7) = *(undefined4 *)k_nhr_double_CRLF;
    sVar6 = sVar6 + sVar7 + 4;
  }
  nhr_free(mem_00);
  nhr_free(mem);
  __s[sVar6] = '\0';
  *local_40 = sVar6;
  return __s;
}

Assistant:

char * nhr_request_create_header_POST(nhr_request r, size_t * header_size) {
    size_t buff_size = 0, writed = 0, headers_len = 0, parameters_len = 0;
    char * buff = NULL, *headers = NULL;
    void * parameters = NULL;
    
    buff_size = strlen(r->path);
    buff_size += strlen(r->host);
    
#if defined(NHR_NO_POST_DATA)
    parameters = nhr_request_create_url_encoded_parameters_POST(r, &parameters_len);
#else
    parameters = r->is_have_data_parameter ? nhr_request_create_data_parameters_POST(r, &parameters_len) : nhr_request_create_url_encoded_parameters_POST(r, &parameters_len);
#endif
    if (parameters) buff_size += parameters_len;
    
    headers = r->http_headers ? nhr_request_http_headers(r->http_headers, &headers_len) : NULL;
    if (headers) buff_size += headers_len;
    
    buff_size += 1 << 8; // extra size for formatting strings
    
    buff = (char *)nhr_malloc(buff_size);
    
    writed = nhr_sprintf(buff, buff_size, "%s %s HTTP/%s\r\n", k_nhr_POST, r->path, k_nhr_request_http_ver);
    
    if (r->port == 80) {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "Host: %s\r\n", r->host);
    } else {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "Host: %s:%i\r\n", r->host, (int)r->port);
    }
    
    if (headers) {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "%s\r\n\r\n", headers);
    } else {
        memcpy(buff + writed, k_nhr_CRLF, k_nhr_CRLF_length);
        writed += k_nhr_CRLF_length;
    }
    
    if (parameters_len > 0) {
        memcpy(buff + writed, parameters, parameters_len);
        writed += parameters_len;
        memcpy(buff + writed, k_nhr_double_CRLF, k_nhr_double_CRLF_length);
        writed += k_nhr_double_CRLF_length;
    }
    
    nhr_free(headers);
    nhr_free(parameters);
    buff[writed] = 0;
    
//    printf("\n\nHEADER POST: \n%s", buff);
    
    *header_size = writed;
    return buff;
}